

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::operator==
          (Mode5TransponderBasicData *this,Mode5TransponderBasicData *Value)

{
  KBOOL KVar1;
  
  KVar1 = Mode5TransponderStatus::operator!=(&this->m_Status,&Value->m_Status);
  if ((((!KVar1) && (this->m_ui16PIN == Value->m_ui16PIN)) &&
      (this->m_ui32MsgFormats == Value->m_ui32MsgFormats)) &&
     (((KVar1 = ModeXCodeRecord::operator!=
                          (&(this->m_EM1Code).super_ModeXCodeRecord,
                           &(Value->m_EM1Code).super_ModeXCodeRecord), !KVar1 &&
       (this->m_ui16NationalOrigin == Value->m_ui16NationalOrigin)) &&
      ((KVar1 = Mode5TransponderSupplementalData::operator!=
                          (&this->m_SupplementalData,&Value->m_SupplementalData), !KVar1 &&
       (this->m_ui8NavSrc == Value->m_ui8NavSrc)))))) {
    return this->m_ui8FigMerit == Value->m_ui8FigMerit;
  }
  return false;
}

Assistant:

KBOOL Mode5TransponderBasicData::operator == ( const Mode5TransponderBasicData & Value ) const
{
    if( m_Status             != Value.m_Status )             return false;
    if( m_ui16PIN            != Value.m_ui16PIN )            return false;
    if( m_ui32MsgFormats     != Value.m_ui32MsgFormats )     return false;
    if( m_EM1Code            != Value.m_EM1Code )            return false;
    if( m_ui16NationalOrigin != Value.m_ui16NationalOrigin ) return false;
    if( m_SupplementalData   != Value.m_SupplementalData )   return false;
    if( m_ui8NavSrc          != Value.m_ui8NavSrc )          return false;
    if( m_ui8FigMerit        != Value.m_ui8FigMerit )        return false;
    return true;
}